

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void __thiscall OjaNewton::compute_AZx(OjaNewton *this)

{
  float *pfVar1;
  int i;
  long lVar2;
  long lVar3;
  
  for (lVar2 = 1; lVar2 <= this->m; lVar2 = lVar2 + 1) {
    (this->data).AZx[lVar2] = 0.0;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      pfVar1 = (this->data).AZx;
      pfVar1[lVar2] = this->A[lVar2][lVar3 + 1] * (this->data).Zx[lVar3 + 1] + pfVar1[lVar2];
    }
  }
  return;
}

Assistant:

void compute_AZx()
  {
    for (int i = 1; i <= m; i++)
    {
      data.AZx[i] = 0;
      for (int j = 1; j <= i; j++)
      {
        data.AZx[i] += A[i][j] * data.Zx[j];
      }
    }
  }